

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rolemaskproxymodel.cpp
# Opt level: O2

void __thiscall RoleMaskProxyModel::setMergeDisplayEdit(RoleMaskProxyModel *this,bool val)

{
  QSet<int> *this_00;
  RoleMaskProxyModelPrivate *this_01;
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  initializer_list<int> args;
  anon_class_1_1_ba1d8281 setMergeDisplayEditContainer;
  iterator idxIter;
  QVector<int> changedRoles;
  
  this_01 = this->d_ptr;
  if (this_01->m_mergeDisplayEdit != val) {
    idxIter.i.d = (Data<QHashPrivate::MultiNode<std::pair<int,_int>,_MaskedItem>_> *)0x200000000;
    args._M_len = 2;
    args._M_array = (iterator)&idxIter;
    setMergeDisplayEditContainer.val = val;
    QList<int>::QList(&changedRoles,args);
    this_01->m_mergeDisplayEdit = val;
    QMultiHash<std::pair<int,_int>,_MaskedItem>::begin(&idxIter,&this_01->m_masked);
    while (idxIter.e != (Chain **)0x0) {
      setMergeDisplayEdit::anon_class_1_1_ba1d8281::operator()
                (&setMergeDisplayEditContainer,(RolesContainer *)*idxIter.e);
      QMultiHash<std::pair<int,_int>,_MaskedItem>::iterator::operator++(&idxIter);
    }
    this_00 = &this_01->m_maskedRoles;
    if (val) {
      idxIter.i.d = (Data<QHashPrivate::MultiNode<std::pair<int,_int>,_MaskedItem>_> *)
                    CONCAT44(idxIter.i.d._4_4_,2);
      QHash<int,_QHashDummyValue>::remove(&this_00->q_hash,(char *)&idxIter);
    }
    else {
      idxIter.i.d = (Data<QHashPrivate::MultiNode<std::pair<int,_int>,_MaskedItem>_> *)
                    ((ulong)idxIter.i.d._4_4_ << 0x20);
      bVar1 = QHash<int,_QHashDummyValue>::contains(&this_00->q_hash,(int *)&idxIter);
      if (bVar1) {
        QSet<int>::insert((QSet<int> *)&idxIter,(int *)this_00);
      }
    }
    if (this_01->m_maskHeaderData == true) {
      iVar2 = QList<QMap<int,_QVariant>_>::begin(&this_01->m_hHeaderData);
      iVar3 = QList<QMap<int,_QVariant>_>::end(&this_01->m_hHeaderData);
      for (; iVar2.i != iVar3.i; iVar2.i = iVar2.i + 1) {
        setMergeDisplayEdit::anon_class_1_1_ba1d8281::operator()
                  (&setMergeDisplayEditContainer,iVar2.i);
      }
      iVar2 = QList<QMap<int,_QVariant>_>::begin(&this_01->m_vHeaderData);
      iVar3 = QList<QMap<int,_QVariant>_>::end(&this_01->m_vHeaderData);
      for (; iVar2.i != iVar3.i; iVar2.i = iVar2.i + 1) {
        setMergeDisplayEdit::anon_class_1_1_ba1d8281::operator()
                  (&setMergeDisplayEditContainer,iVar2.i);
      }
    }
    mergeDisplayEditChanged(this,this_01->m_mergeDisplayEdit);
    idxIter.i.d = (Data<QHashPrivate::MultiNode<std::pair<int,_int>,_MaskedItem>_> *)
                  0xffffffffffffffff;
    idxIter.i.bucket = 0;
    idxIter.e = (Chain **)0x0;
    RoleMaskProxyModelPrivate::signalAllChanged(this_01,&changedRoles,(QModelIndex *)&idxIter);
    QArrayDataPointer<int>::~QArrayDataPointer(&changedRoles.d);
  }
  return;
}

Assistant:

void RoleMaskProxyModel::setMergeDisplayEdit(bool val)
{
    const auto setMergeDisplayEditContainer = [val](RolesContainer &container) {
        if (val) {
            if (container.contains(Qt::DisplayRole)) {
                container.remove(Qt::EditRole);
            } else {
                const auto roleIter = container.constFind(Qt::EditRole);
                if (roleIter != container.constEnd()) {
                    container.insert(Qt::DisplayRole, *roleIter);
                    container.remove(Qt::EditRole);
                }
            }
        } else {
            const auto roleIter = container.constFind(Qt::DisplayRole);
            if (roleIter != container.constEnd()) {
                container.insert(Qt::EditRole, *roleIter);
            }
        }
    };
    Q_D(RoleMaskProxyModel);
    if (d->m_mergeDisplayEdit != val) {
        QVector<int> changedRoles({Qt::DisplayRole, Qt::EditRole});
        d->m_mergeDisplayEdit = val;
        for (auto idxIter = d->m_masked.begin(), idxEnd = d->m_masked.end(); idxIter != idxEnd; ++idxIter)
            setMergeDisplayEditContainer(idxIter->m_data.roles);
        if (val)
            d->m_maskedRoles.remove(Qt::EditRole);
        else if (d->m_maskedRoles.contains(Qt::DisplayRole))
            d->m_maskedRoles.insert(Qt::EditRole);
        if (d->m_maskHeaderData) {
            for (auto idxIter = d->m_hHeaderData.begin(), idxEnd = d->m_hHeaderData.end(); idxIter != idxEnd; ++idxIter)
                setMergeDisplayEditContainer(*idxIter);
            for (auto idxIter = d->m_vHeaderData.begin(), idxEnd = d->m_vHeaderData.end(); idxIter != idxEnd; ++idxIter)
                setMergeDisplayEditContainer(*idxIter);
        }
        mergeDisplayEditChanged(d->m_mergeDisplayEdit);
        d->signalAllChanged(changedRoles);
    }
}